

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resampler.cpp
# Opt level: O3

void __thiscall
cubeb_resampler_passthrough_duplex_callback_reordering_Test::TestBody
          (cubeb_resampler_passthrough_duplex_callback_reordering_Test *this)

{
  short sVar1;
  bool bVar2;
  cubeb_resampler *resampler;
  long lVar3;
  stringstream *psVar4;
  ulong uVar5;
  internal *input_frames_count;
  float *input_buffer;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  char *pcVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  int iVar12;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  long lVar13;
  long lVar14;
  undefined1 auVar15 [16];
  long lVar16;
  long lVar17;
  long lVar18;
  int iVar19;
  long got;
  long zero;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c98;
  long BUF_BASE_SIZE;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c88;
  long frames;
  long prebuffer_frames;
  closure c;
  AssertHelper local_1c68;
  cubeb_stream_params output_params;
  cubeb_stream_params input_params;
  float input_buffer_normal [256];
  float input_buffer_glitch [512];
  float input_buffer_prebuffer [512];
  float output_buffer [512];
  
  input_params.channels = 1;
  input_params.format = CUBEB_SAMPLE_FLOAT32LE;
  input_params.rate = 0xac44;
  output_params.channels = 2;
  output_params.format = CUBEB_SAMPLE_FLOAT32LE;
  output_params.rate = 0xac44;
  c.input_channel_count = 1;
  resampler = cubeb_resampler_create
                        ((cubeb_stream *)0x0,&input_params,&output_params,0xac44,
                         cb_passthrough_resampler_duplex,&c,CUBEB_RESAMPLER_QUALITY_VOIP,
                         CUBEB_RESAMPLER_RECLOCK_NONE);
  BUF_BASE_SIZE = 0x100;
  uVar9 = 0x200 / (ulong)input_params.channels;
  if (input_params.channels < 0x201) {
    lVar7 = uVar9 - 1;
    auVar10._8_4_ = (int)lVar7;
    auVar10._0_8_ = lVar7;
    auVar10._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar5 = 0;
    auVar15 = _DAT_00132050;
    do {
      bVar2 = SUB164(auVar10 ^ _DAT_00132060,0) < SUB164(auVar15 ^ _DAT_00132060,0);
      iVar12 = SUB164(auVar10 ^ _DAT_00132060,4);
      iVar19 = SUB164(auVar15 ^ _DAT_00132060,4);
      if ((bool)(~(iVar12 < iVar19 || iVar19 == iVar12 && bVar2) & 1)) {
        input_buffer_prebuffer[uVar5] = (float)(long)uVar5;
      }
      if (iVar12 >= iVar19 && (iVar19 != iVar12 || !bVar2)) {
        input_buffer_prebuffer[uVar5 + 1] = (float)(long)(uVar5 + 1);
      }
      uVar5 = uVar5 + 2;
      lVar7 = auVar15._8_8_;
      auVar15._0_8_ = auVar15._0_8_ + 2;
      auVar15._8_8_ = lVar7 + 2;
    } while (((int)uVar9 + 1U & 0x7fe) != uVar5);
  }
  prebuffer_frames = uVar9;
  got = cubeb_resampler_fill(resampler,input_buffer_prebuffer,&prebuffer_frames,output_buffer,0x100)
  ;
  testing::internal::CmpHelperEQ<long,long>
            ((internal *)input_buffer_glitch,"prebuffer_frames","BUF_BASE_SIZE",&prebuffer_frames,
             &BUF_BASE_SIZE);
  if (input_buffer_glitch[0]._0_1_ == '\0') {
    psVar4 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar4);
    *(undefined8 *)(psVar4 + *(long *)(*(long *)(psVar4 + 0x10) + -0x18) + 0x18) = 0x11;
    if (input_buffer_glitch._8_8_ == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)input_buffer_glitch._8_8_;
    }
    iVar12 = 0x2fe;
    input_buffer_normal._0_8_ = psVar4;
  }
  else {
    uVar8 = 0;
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(input_buffer_glitch + 2),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    testing::internal::CmpHelperEQ<long,long>
              ((internal *)input_buffer_glitch,"got","BUF_BASE_SIZE",&got,&BUF_BASE_SIZE);
    if (input_buffer_glitch[0]._0_1_ != '\0') {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(input_buffer_glitch + 2),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      lVar7 = 0x100;
      do {
        frames = 0x100;
        sVar1 = (short)((uVar8 & 0xffff) / 100);
        if ((short)uVar8 == (short)(sVar1 * 100) && uVar8 != 0) {
          zero = 0;
LAB_0010a163:
          input_buffer = input_buffer_normal;
          input_frames_count = (internal *)&zero;
        }
        else {
          auVar11._8_4_ = (int)uVar9;
          auVar11._0_8_ = uVar9;
          auVar11._12_4_ = (int)(uVar9 >> 0x20);
          lVar13 = auVar11._8_8_;
          if ((short)((short)uVar8 + sVar1 * -100) != 1) {
            lVar3 = 0;
            lVar14 = 0;
            lVar16 = 1;
            lVar17 = 2;
            lVar18 = 3;
            do {
              *(ulong *)(input_buffer_normal + lVar3) =
                   CONCAT44((float)(lVar16 + lVar13),(float)(long)(lVar14 + uVar9));
              *(ulong *)(input_buffer_normal + lVar3 + 2) =
                   CONCAT44((float)(lVar18 + lVar13),(float)(long)(lVar17 + uVar9));
              lVar3 = lVar3 + 4;
              lVar14 = lVar14 + 4;
              lVar16 = lVar16 + 4;
              lVar17 = lVar17 + 4;
              lVar18 = lVar18 + 4;
            } while (lVar3 != 0x100);
            uVar9 = uVar9 + 0x100;
            zero = 0x100;
            goto LAB_0010a163;
          }
          lVar3 = 0;
          lVar14 = 0;
          lVar16 = 1;
          lVar17 = 2;
          lVar18 = 3;
          do {
            *(ulong *)(input_buffer_glitch + lVar3) =
                 CONCAT44((float)(lVar16 + lVar13),(float)(long)(lVar14 + uVar9));
            *(ulong *)(input_buffer_glitch + lVar3 + 2) =
                 CONCAT44((float)(lVar18 + lVar13),(float)(long)(lVar17 + uVar9));
            lVar3 = lVar3 + 4;
            lVar14 = lVar14 + 4;
            lVar16 = lVar16 + 4;
            lVar17 = lVar17 + 4;
            lVar18 = lVar18 + 4;
          } while (lVar3 != 0x200);
          uVar9 = uVar9 + 0x200;
          frames = 0x200;
          input_buffer = input_buffer_glitch;
          input_frames_count = (internal *)&frames;
        }
        got = cubeb_resampler_fill
                        (resampler,input_buffer,(long *)input_frames_count,output_buffer,0x100);
        is_seq<float>(output_buffer,2,0x100,lVar7);
        testing::internal::CmpHelperEQ<long,long>
                  ((internal *)&zero,"got","BUF_BASE_SIZE",&got,&BUF_BASE_SIZE);
        if ((char)zero == '\0') {
          psVar4 = (stringstream *)operator_new(0x188);
          std::__cxx11::stringstream::stringstream(psVar4);
          *(undefined8 *)(psVar4 + *(long *)(*(long *)(psVar4 + 0x10) + -0x18) + 0x18) = 0x11;
          if (local_1c98.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar6 = "";
          }
          else {
            pcVar6 = ((local_1c98.ptr_)->_M_dataplus)._M_p;
          }
          local_1c88.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar4;
          testing::internal::AssertHelper::AssertHelper
                    (&local_1c68,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
                     ,0x31a,pcVar6);
          testing::internal::AssertHelper::operator=(&local_1c68,(Message *)&local_1c88);
          testing::internal::AssertHelper::~AssertHelper(&local_1c68);
          if (((local_1c88.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
              (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
             (local_1c88.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_1c88.ptr_ + 8))();
          }
          this_00 = &local_1c98;
          goto LAB_0010a347;
        }
        lVar7 = lVar7 + 0x100;
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_1c98,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
               );
        uVar8 = uVar8 + 1;
        if (uVar8 == 300) {
          cubeb_resampler_destroy(resampler);
          return;
        }
      } while( true );
    }
    psVar4 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(psVar4);
    *(undefined8 *)(psVar4 + *(long *)(*(long *)(psVar4 + 0x10) + -0x18) + 0x18) = 0x11;
    if (input_buffer_glitch._8_8_ == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)input_buffer_glitch._8_8_;
    }
    iVar12 = 0x2ff;
    input_buffer_normal._0_8_ = psVar4;
  }
  this_00 = (scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(input_buffer_glitch + 2);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&zero,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_resampler.cpp"
             ,iVar12,pcVar6);
  testing::internal::AssertHelper::operator=((AssertHelper *)&zero,(Message *)input_buffer_normal);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&zero);
  if (((input_buffer_normal._0_8_ != 0) && (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
     (input_buffer_normal._0_8_ != 0)) {
    (**(code **)(*(long *)input_buffer_normal._0_8_ + 8))();
  }
LAB_0010a347:
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(cubeb, resampler_passthrough_duplex_callback_reordering)
{
  // Test that when pre-buffering on resampler creation, we can survive an input
  // callback being delayed.

  cubeb_stream_params input_params;
  cubeb_stream_params output_params;

  const int input_channels = 1;
  const int output_channels = 2;

  input_params.channels = input_channels;
  input_params.rate = 44100;
  input_params.format = CUBEB_SAMPLE_FLOAT32NE;

  output_params.channels = output_channels;
  output_params.rate = input_params.rate;
  output_params.format = CUBEB_SAMPLE_FLOAT32NE;

  int target_rate = input_params.rate;

  closure c;
  c.input_channel_count = input_channels;

  cubeb_resampler * resampler =
    cubeb_resampler_create((cubeb_stream*)nullptr, &input_params, &output_params,
                           target_rate, cb_passthrough_resampler_duplex, &c,
                           CUBEB_RESAMPLER_QUALITY_VOIP,
                           CUBEB_RESAMPLER_RECLOCK_NONE);

  const long BUF_BASE_SIZE = 256;
  float input_buffer_prebuffer[input_channels * BUF_BASE_SIZE * 2];
  float input_buffer_glitch[input_channels * BUF_BASE_SIZE * 2];
  float input_buffer_normal[input_channels * BUF_BASE_SIZE];
  float output_buffer[output_channels * BUF_BASE_SIZE];

  long seq_idx = 0;
  long output_seq_idx = 0;

  long prebuffer_frames = ARRAY_LENGTH(input_buffer_prebuffer) / input_params.channels;
  seq_idx = seq(input_buffer_prebuffer, input_channels, seq_idx,
                prebuffer_frames);

  long got = cubeb_resampler_fill(resampler, input_buffer_prebuffer, &prebuffer_frames,
                                  output_buffer, BUF_BASE_SIZE);

  output_seq_idx += BUF_BASE_SIZE;

  // prebuffer_frames will hold the frames used by the resampler.
  ASSERT_EQ(prebuffer_frames, BUF_BASE_SIZE);
  ASSERT_EQ(got, BUF_BASE_SIZE);

  for (uint32_t i = 0; i < 300; i++) {
    long int frames = BUF_BASE_SIZE;
    // Simulate that sometimes, we don't have the input callback on time
    if (i != 0 && (i % 100) == 0) {
      long zero = 0;
      got = cubeb_resampler_fill(resampler, input_buffer_normal /* unused here */,
                                 &zero, output_buffer, BUF_BASE_SIZE);
      is_seq(output_buffer, 2, BUF_BASE_SIZE, output_seq_idx);
      output_seq_idx += BUF_BASE_SIZE;
    } else if (i != 0 && (i % 100) == 1) {
      // if this is the case, the on the next iteration, we'll have twice the
      // amount of input frames
      seq_idx = seq(input_buffer_glitch, input_channels, seq_idx, BUF_BASE_SIZE * 2);
      frames = 2 * BUF_BASE_SIZE;
      got = cubeb_resampler_fill(resampler, input_buffer_glitch, &frames, output_buffer, BUF_BASE_SIZE);
      is_seq(output_buffer, 2, BUF_BASE_SIZE, output_seq_idx);
      output_seq_idx += BUF_BASE_SIZE;
    } else {
       // normal case
      seq_idx = seq(input_buffer_normal, input_channels, seq_idx, BUF_BASE_SIZE);
      long normal_input_frame_count = 256;
      got = cubeb_resampler_fill(resampler, input_buffer_normal, &normal_input_frame_count, output_buffer, BUF_BASE_SIZE);
      is_seq(output_buffer, 2, BUF_BASE_SIZE, output_seq_idx);
      output_seq_idx += BUF_BASE_SIZE;
    }
    ASSERT_EQ(got, BUF_BASE_SIZE);
  }

  cubeb_resampler_destroy(resampler);
}